

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int PaletteHasNonMonotonousDeltas(uint32_t *palette,int num_colors)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  byte bVar4;
  int in_ESI;
  long in_RDI;
  uint8_t bd;
  uint8_t gd;
  uint8_t rd;
  uint32_t diff;
  uint8_t sign_found;
  int i;
  uint32_t predict;
  undefined1 local_15;
  undefined4 local_14;
  undefined4 local_10;
  
  local_10 = 0;
  local_15 = 0;
  for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
    uVar3 = VP8LSubPixels(*(uint32_t *)(in_RDI + (long)local_14 * 4),local_10);
    bVar1 = (byte)(uVar3 >> 0x10);
    bVar2 = (byte)(uVar3 >> 8);
    if (bVar1 != 0) {
      bVar4 = 2;
      if (bVar1 < 0x80) {
        bVar4 = 1;
      }
      local_15 = local_15 | bVar4;
    }
    if (bVar2 != 0) {
      bVar1 = 0x10;
      if (bVar2 < 0x80) {
        bVar1 = 8;
      }
      local_15 = local_15 | bVar1;
    }
    if ((byte)uVar3 != 0) {
      bVar1 = 0x80;
      if ((byte)uVar3 < 0x80) {
        bVar1 = 0x40;
      }
      local_15 = local_15 | bVar1;
    }
    local_10 = *(uint32_t *)(in_RDI + (long)local_14 * 4);
  }
  return (int)((local_15 & local_15 << 1) != 0);
}

Assistant:

static int PaletteHasNonMonotonousDeltas(const uint32_t* const palette,
                                         int num_colors) {
  uint32_t predict = 0x000000;
  int i;
  uint8_t sign_found = 0x00;
  for (i = 0; i < num_colors; ++i) {
    const uint32_t diff = VP8LSubPixels(palette[i], predict);
    const uint8_t rd = (diff >> 16) & 0xff;
    const uint8_t gd = (diff >>  8) & 0xff;
    const uint8_t bd = (diff >>  0) & 0xff;
    if (rd != 0x00) {
      sign_found |= (rd < 0x80) ? 1 : 2;
    }
    if (gd != 0x00) {
      sign_found |= (gd < 0x80) ? 8 : 16;
    }
    if (bd != 0x00) {
      sign_found |= (bd < 0x80) ? 64 : 128;
    }
    predict = palette[i];
  }
  return (sign_found & (sign_found << 1)) != 0;  // two consequent signs.
}